

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
          *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *in_RSI;
  long *in_RDI;
  bool dummy [3];
  bool same;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *typed_other;
  GTestLog *in_stack_ffffffffffffff50;
  bool local_99;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff68;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff70;
  ParamIterator<libaom_test::TestMode> *this_00;
  bool local_81;
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
  *in_stack_ffffffffffffff80;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 in_stack_ffffffffffffffc8;
  GTestLogSeverity severity;
  GTestLog *in_stack_ffffffffffffffd0;
  GTestLog local_1c;
  long *local_18;
  bool local_1;
  
  severity = (GTestLogSeverity)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_18 = in_RSI;
  lVar2 = (**(code **)(*in_RDI + 0x10))();
  lVar3 = (**(code **)(*local_18 + 0x10))();
  bVar1 = IsTrue(lVar2 == lVar3);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_ffffffffffffffd0,severity,
                       (char *)CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT25(in_stack_ffffffffffffffc5,
                                                 CONCAT14(in_stack_ffffffffffffffc4,
                                                          in_stack_ffffffffffffffc0))),
                       (int)((ulong)lVar2 >> 0x20));
    poVar4 = GTestLog::GetStream(&local_1c);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    in_stack_ffffffffffffff90 =
         (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *)
         std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffff50);
  }
  CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,unsigned_int>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>const,testing::internal::ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,unsigned_int>>const>
            (in_stack_ffffffffffffff80);
  bVar1 = AtEnd(in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = AtEnd(in_stack_ffffffffffffff90), bVar1)) {
    local_1 = true;
  }
  else {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ad051);
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ad067);
    bVar1 = ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = (ParamIterator<libaom_test::TestMode> *)&stack0xffffffffffffffc5;
    local_81 = false;
    if (bVar1) {
      in_stack_ffffffffffffff68 =
           (ParamIterator<const_libaom_test::CodecFactory_*> *)
           std::
           get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                     ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                       *)0x7ad0b4);
      std::
      get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                  *)0x7ad0ca);
      local_81 = ParamIterator<libaom_test::TestMode>::operator==
                           (this_00,(ParamIterator<libaom_test::TestMode> *)
                                    in_stack_ffffffffffffff68);
    }
    *(bool *)&(this_00->impl_)._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
              .
              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
              ._M_head_impl = local_81;
    local_99 = false;
    if ((local_81 & 1U) != 0) {
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                  *)0x7ad11b);
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                  *)0x7ad131);
      local_99 = ParamIterator<unsigned_int>::operator==
                           ((ParamIterator<unsigned_int> *)this_00,
                            (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff68);
    }
    local_1 = local_99;
  }
  return local_1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }